

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

bool __thiscall pg::pm_less(pg *this,int *a,int *b,int k,int pl)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  bVar1 = (byte)pl;
  if ((int)b < 1) {
LAB_001692f9:
    bVar3 = bVar1;
    bVar6 = false;
  }
  else {
    uVar4 = *(uint *)this;
    uVar5 = *a;
    bVar3 = 1;
    bVar6 = true;
    if (uVar4 == uVar5) {
      uVar2 = 0;
      do {
        bVar1 = 1;
        if (((ulong)b & 0xffffffff) - 1 == uVar2) goto LAB_001692f9;
        uVar4 = *(uint *)(this + uVar2 * 4 + 4);
        uVar5 = a[uVar2 + 1];
        uVar2 = uVar2 + 1;
      } while (uVar4 == uVar5);
      bVar6 = uVar2 < ((ulong)b & 0xffffffff);
    }
    if (uVar4 != 0xffffffff) {
      if (uVar5 == 0xffffffff) {
        bVar3 = 0;
      }
      else if ((uVar4 & 1) == k) {
        bVar3 = (int)uVar4 < (int)uVar5 && (uVar5 & 1) == k;
      }
      else {
        bVar3 = (int)uVar5 < (int)uVar4 || (uVar5 & 1) == k;
      }
    }
  }
  return (bool)(bVar6 & bVar3);
}

Assistant:

static bool
pm_less(int* a, int* b, int k, int pl)
{
    // remember: _ < 5 < 3 < 1 < 0 < 2 < 4 < 6 (even measures, solving for odd)
    // remember: _ < 6 < 4 < 2 < 0 < 1 < 3 < 5 (odd measures, solving for even)

    for (int i=0; i<k; i++) {
        // if equal, then continue with next
        if (a[i] == b[i]) continue;
        // cases where a[i] is _ or b[i] is _
        if (a[i] == -1) return true;
        if (b[i] == -1) return false;
        // case distinction based on parity
        const bool a_is_pl = (a[i]&1) == pl;
        const bool b_is_pl = (b[i]&1) == pl;
        if (a_is_pl) {
            if (b_is_pl) return a[i] < b[i];
            else return false;
        } else {
            if (b_is_pl) return true;
            else return a[i] > b[i];
        }
    }
    // they are equal, so not less...
    return false;
}